

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *__format;
  long lVar3;
  string req_locale;
  string the_locale;
  string tests_data_path;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tests_data_path,"tests/",(allocator<char> *)&req_locale);
  lVar3 = 1;
  while( true ) {
    if (argc <= lVar3) {
      InitTestEngine((TestFailEventListener)0x0);
      req_locale._M_dataplus._M_p = (pointer)&req_locale.field_2;
      req_locale._M_string_length = 0;
      req_locale.field_2._M_local_buf[0] = '\0';
      bVar1 = flatbuffers::ReadEnvironmentVariable("FLATBUFFERS_TEST_LOCALE",&req_locale);
      if (bVar1) {
        printf("The environment variable FLATBUFFERS_TEST_LOCALE=%s",req_locale._M_dataplus._M_p);
        putchar(10);
        flatbuffers::RemoveStringQuotes(&the_locale,&req_locale);
        std::__cxx11::string::operator=((string *)&req_locale,(string *)&the_locale);
        std::__cxx11::string::~string((string *)&the_locale);
        the_locale._M_dataplus._M_p = (pointer)&the_locale.field_2;
        the_locale._M_string_length = 0;
        the_locale.field_2._M_local_buf[0] = '\0';
        bVar1 = flatbuffers::SetGlobalTestLocale(req_locale._M_dataplus._M_p,&the_locale);
        TestEq<bool,bool>(true,bVar1,
                          "\'true\' != \'flatbuffers::SetGlobalTestLocale(req_locale.c_str(), &the_locale)\'"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                          ,0x6d5,"int main(int, const char **)");
        printf("The global C-locale changed: %s",the_locale._M_dataplus._M_p);
        putchar(10);
        std::__cxx11::string::~string((string *)&the_locale);
      }
      std::operator+(&the_locale,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/",
                     &tests_data_path);
      std::__cxx11::string::operator=((string *)&tests_data_path,(string *)&the_locale);
      std::__cxx11::string::~string((string *)&the_locale);
      flatbuffers::tests::anon_unknown_0::FlatBufferTests(&tests_data_path);
      FlatBufferBuilderTest();
      if (testing_fails == 0) {
        printf("ALL TESTS PASSED");
      }
      else {
        printf("%d FAILED TESTS");
      }
      putchar(10);
      iVar2 = CloseTestEngine(false);
      std::__cxx11::string::~string((string *)&req_locale);
      std::__cxx11::string::~string((string *)&tests_data_path);
      return iVar2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&req_locale,argv[lVar3],(allocator<char> *)&the_locale);
    bVar1 = std::operator==(&req_locale,"--test_path");
    if (!bVar1) break;
    if (argc <= (int)lVar3 + 1) {
      __format = "error: missing path following: %s\n";
      goto LAB_00174516;
    }
    std::__cxx11::string::assign((char *)&tests_data_path);
    std::__cxx11::string::~string((string *)&req_locale);
    lVar3 = lVar3 + 2;
  }
  __format = "error: Unknown argument: %s\n";
LAB_00174516:
  fprintf(_stderr,__format,req_locale._M_dataplus._M_p);
  exit(1);
}

Assistant:

int main(int argc, const char *argv[]) {
  std::string tests_data_path = "tests/";

  for (int argi = 1; argi < argc; argi++) {
    std::string arg = argv[argi];
    if (arg == "--test_path") {
      if (++argi >= argc) {
        fprintf(stderr, "error: missing path following: %s\n", arg.c_str());
        exit(1);
      }
      // Override default path if provided one.
      tests_data_path = argv[argi];

    } else {
      fprintf(stderr, "error: Unknown argument: %s\n", arg.c_str());
      exit(1);
    }
  }

  InitTestEngine();

  std::string req_locale;
  if (flatbuffers::ReadEnvironmentVariable("FLATBUFFERS_TEST_LOCALE",
                                           &req_locale)) {
    TEST_OUTPUT_LINE("The environment variable FLATBUFFERS_TEST_LOCALE=%s",
                     req_locale.c_str());
    req_locale = flatbuffers::RemoveStringQuotes(req_locale);
    std::string the_locale;
    TEST_ASSERT_FUNC(
        flatbuffers::SetGlobalTestLocale(req_locale.c_str(), &the_locale));
    TEST_OUTPUT_LINE("The global C-locale changed: %s", the_locale.c_str());
  }

#ifdef FLATBUFFERS_TEST_PATH_PREFIX
  tests_data_path =
      FLATBUFFERS_STRING(FLATBUFFERS_TEST_PATH_PREFIX) + tests_data_path;
#endif

  flatbuffers::tests::FlatBufferTests(tests_data_path);
  FlatBufferBuilderTest();

  if (!testing_fails) {
    TEST_OUTPUT_LINE("ALL TESTS PASSED");
  } else {
    TEST_OUTPUT_LINE("%d FAILED TESTS", testing_fails);
  }
  return CloseTestEngine();
}